

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workWithFilesAndCiphertext.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
fileToDWORDmas(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
              string *filePath)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  uint *puVar4;
  size_type sVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  unsigned_long sizeOfBuffer;
  pos_type fileSize;
  char local_220 [8];
  ifstream fs;
  string *filePath_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr;
  
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ifstream::ifstream(local_220,(string *)filePath,_Var2);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    exit(1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::istream::seekg((long)local_220,_S_beg);
  auVar7 = std::istream::tellg();
  _fileSize = auVar7._8_8_;
  sizeOfBuffer = auVar7._0_8_;
  std::istream::seekg((long)local_220,_S_beg);
  uVar3 = std::fpos::operator_cast_to_long((fpos *)&sizeOfBuffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(uVar3 >> 2) + 1);
  puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(__return_storage_ptr__);
  std::fpos::operator_cast_to_long((fpos *)&sizeOfBuffer);
  std::istream::read(local_220,(long)puVar4);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(__return_storage_ptr__);
  if ((sVar5 & 3) != 0) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(__return_storage_ptr__);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(__return_storage_ptr__);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (__return_storage_ptr__,sVar5 + ((uint)sVar6 & 3));
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned> fileToDWORDmas(const std::string &filePath) {
    std::ifstream fs(filePath, std::ios_base::out | std::ios_base::binary);
    if (fs.fail()) {
        exit(1);
    }

    std::vector<unsigned> arr;
    fs.seekg(0, std::ios::end);
    auto fileSize = fs.tellg();
    fs.seekg(0, std::ios::beg);

    auto sizeOfBuffer = fileSize / sizeof(unsigned);

    arr.resize(static_cast<unsigned long>(sizeOfBuffer + 1));
    fs.read(reinterpret_cast<char *>(arr.data()), fileSize);

    if (arr.size() % 4 != 0)
        arr.resize(arr.size() + arr.size() % 4);
    return arr;
}